

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ht_hash_table *ht;
  char *__s;
  size_t sVar1;
  long *plVar2;
  
  ht = ht_new();
  ht_insert(ht,"abc","123");
  __s = ht_search(ht,"abc");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"find value: ",0xc);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x113148);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  ht_delete(ht,"abc");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hash table size: ",0x11)
  ;
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,ht->count);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  ht_del_hash_table(ht);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    // chapter1::demo1();
    // chapter1::demo2();
    // chapter1::demo2_cstyle();
    // chapter1::demo3();
    // chapter1::file_op();

    /// ---
    // vector<int> pent;
    // const string title("Pentagonal Numeric Series: ");

    /*if (chapter2::calc_elements(pent, 0)) {
        chapter2::display_elem(pent, title);
    }

    if (chapter2::calc_elements(pent, 10)) {
        chapter2::display_elem(pent, title);
    }*/

    // with inline
    /*if (chapter2::calc_elems(pent, 12)) {
        chapter2::display_elem(pent, title);
    }

    if (chapter2::calc_elems(pent, 10)) {
        chapter2::display_elem(pent, title);
    }*/

    /*int elem;
    if (chapter2::find_elem(128, elem)) {
        cout << elem << endl;
    }*/

    // chapter2::max(1, 2);
    // chapter2::max2(3, 2);


    /// ---
    // chapter3::main();

    // chapter4::main();

    /// test for hash table
    ht_hash_table* ht = ht_new();
    auto k = const_cast<char *>("abc");
    auto v = const_cast<char *>("123");
    ht_insert(ht, k, v);
    char* v2 = ht_search(ht, k);
    std::cout << "find value: " << v2 << std::endl;
    ht_delete(ht, k);
    std::cout << "hash table size: " << ht->count << std::endl;
    ht_del_hash_table(ht);
}